

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O0

Block * __thiscall Js::CompoundString::BlockInfo::Resize(BlockInfo *this,Recycler *recycler)

{
  uint uVar1;
  void *buffer;
  code *pcVar2;
  char16_t *dst;
  bool bVar3;
  CharCount CVar4;
  CharCount CVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  Type *pTVar8;
  void **ppvVar9;
  Block *block_00;
  Block *block;
  CharCount charLength;
  TrackAllocData local_58;
  char16_t *local_30;
  void *newBuffer;
  Recycler *pRStack_20;
  CharCount newCharCapacity;
  Recycler *recycler_local;
  BlockInfo *this_local;
  
  pRStack_20 = recycler;
  recycler_local = (Recycler *)this;
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x191,"(recycler)","recycler");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  CVar4 = CharLength(this);
  CVar4 = AlignCharCapacityForAllocation(CVar4);
  newBuffer._4_4_ = GrowCharCapacity(CVar4);
  bVar3 = ShouldAllocateBuffer(newBuffer._4_4_);
  pRVar7 = pRStack_20;
  if (bVar3) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&char16_t::typeinfo,0,(ulong)newBuffer._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
               ,0x196);
    pRVar7 = Memory::Recycler::TrackAllocInfo(pRVar7,&local_58);
    local_30 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar7,(Recycler *)Memory::Recycler::Alloc,0,
                          (ulong)newBuffer._4_4_);
    this->charCapacity = newBuffer._4_4_;
    CVar4 = CharLength(this);
    pTVar8 = Block::Pointers(local_30);
    CVar5 = Block::PointerLengthFromCharLength(this->charCapacity);
    Memory::
    ArrayWriteBarrierVerifyBits<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (pTVar8,(ulong)CVar5);
    dst = local_30;
    uVar1 = this->charCapacity;
    ppvVar9 = Memory::PointerValue<void>(&this->buffer);
    js_wmemcpy_s(dst,(ulong)uVar1,(char16 *)*ppvVar9,(ulong)CVar4);
    Memory::WriteBarrierPtr<void>::operator=(&this->buffer,local_30);
    pTVar8 = Pointers(this);
    CVar4 = PointerLength(this);
    Memory::
    ArrayWriteBarrier<Memory::WriteBarrierPtr<void>,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              (pTVar8,(ulong)CVar4);
    this_local = (BlockInfo *)0x0;
  }
  else {
    ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)this);
    buffer = *ppvVar9;
    CVar4 = CharLength(this);
    block_00 = Block::New(buffer,CVar4,true,pRStack_20);
    CopyFrom(this,block_00);
    this_local = (BlockInfo *)block_00;
  }
  return (Block *)this_local;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::Resize(Recycler *const recycler)
    {
        Assert(recycler);

        const CharCount newCharCapacity = GrowCharCapacity(AlignCharCapacityForAllocation(CharLength()));
        if(ShouldAllocateBuffer(newCharCapacity))
        {
            void *const newBuffer = RecyclerNewArray(recycler, char16, newCharCapacity);
            charCapacity = newCharCapacity;
            const CharCount charLength = CharLength();

            ArrayWriteBarrierVerifyBits(Block::Pointers(newBuffer), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s((char16*)newBuffer, charCapacity, (char16*)PointerValue(buffer), charLength);
            buffer = newBuffer;
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, CharLength(), true, recycler);
        CopyFrom(block);
        return block;
    }